

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesGeneric::Build_M
          (ChVariablesGeneric *this,ChSparseMatrix *storage,int insrow,int inscol,double c_a)

{
  Scalar *pSVar1;
  int col;
  long col_00;
  long row;
  
  for (row = 0; row < (this->Mmass).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                      .m_storage.m_rows; row = row + 1) {
    for (col_00 = 0;
        col_00 < (this->Mmass).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols; col_00 = col_00 + 1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                          &this->Mmass,row,col_00);
      (**storage->_vptr_SparseMatrix)
                (c_a * *pSVar1,storage,(ulong)(uint)((int)row + insrow),
                 (ulong)(uint)(inscol + (int)col_00),1);
    }
  }
  return;
}

Assistant:

void ChVariablesGeneric::Build_M(ChSparseMatrix& storage, int insrow, int inscol, const double c_a) {
    for (int row = 0; row < Mmass.rows(); ++row)
        for (int col = 0; col < Mmass.cols(); ++col)
            storage.SetElement(insrow + row, inscol + col, c_a * Mmass(row, col));
}